

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::XMLReader::getUpToCharOrWS(XMLReader *this,XMLBuffer *toFill,XMLCh toCheck)

{
  ulong uVar1;
  XMLCh XVar2;
  bool bVar3;
  XMLSize_t XVar4;
  XMLCh curCh;
  XMLCh local_2a;
  
  while( true ) {
    while (uVar1 = this->fCharIndex, this->fCharsAvail <= uVar1) {
      bVar3 = refreshCharBuffer(this);
      if (!bVar3) {
        return false;
      }
    }
    local_2a = this->fCharBuf[uVar1];
    if ((local_2a == toCheck) || ((char)this->fgCharCharsTable[(ushort)local_2a] < '\0')) break;
    this->fCharIndex = uVar1 + 1;
    if ((local_2a & 0xdf52U) == 0) {
      handleEOL(this,&local_2a,false);
    }
    else {
      this->fCurCol = this->fCurCol + 1;
    }
    XVar2 = local_2a;
    XVar4 = toFill->fIndex;
    if (XVar4 == toFill->fCapacity) {
      XMLBuffer::ensureCapacity(toFill,1);
      XVar4 = toFill->fIndex;
    }
    toFill->fIndex = XVar4 + 1;
    toFill->fBuffer[XVar4] = XVar2;
  }
  return true;
}

Assistant:

bool XMLReader::getUpToCharOrWS(XMLBuffer& toFill, const XMLCh toCheck)
{
    while (true)
    {
        // Loop through the current chars in the buffer
        while (fCharIndex < fCharsAvail)
        {
            // Get the current char out of the buffer
            XMLCh curCh = fCharBuf[fCharIndex];

            //
            //  See if its not a white space or our target char, then process
            //  it. Else, we need to return.
            //
            if (!isWhitespace(curCh) && (curCh != toCheck))
            {
                // Eat this char
                fCharIndex++;

                //
                //  'curCh' is not a whitespace(x20|x9|xD|xA), so we only can
                //  have end-of-line combinations with a leading chNEL(x85) or
                //  chLineSeparator(x2028)
                //
                //  0010000000101000 chLineSeparator
                //  0000000010000101 chNEL
                //  ---------------------
                //  1101111101010010 == ~(chNEL|chLineSeparator)
                //
                //  if the result of the logical-& operation is
                //  true  : 'curCh' can not be chNEL or chLineSeparator
                //  false : 'curCh' can be chNEL or chLineSeparator
                //
                if ( curCh & (XMLCh) ~(chNEL|chLineSeparator) )
                {
                    fCurCol++;
                } else
                {
                    handleEOL(curCh, false);
                }

                // Add it to our buffer
                toFill.append(curCh);
            }
             else
            {
                return true;
            }
        }

        //
        //  We've eaten up the current buffer, so lets try to reload it. If
        //  we don't get anything new, then break out. If we do, then we go
        //  back to the top to keep getting spaces.
        //
        if (!refreshCharBuffer())
            break;
    }

    // We never hit any non-space and ate up the whole reader
    return false;

}